

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::RadixPartitionedHashTable::RadixPartitionedHashTable
          (RadixPartitionedHashTable *this,GroupingSet *grouping_set_p,GroupedAggregateData *op_p)

{
  vector<duckdb::LogicalType,_true> *this_00;
  iterator __position;
  GroupingSet *pGVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 *puVar4;
  const_reference __x;
  _Base_ptr p_Var5;
  TupleDataLayout *this_02;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  vector<duckdb::LogicalType,_true> group_types_copy;
  undefined1 local_99;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  shared_ptr<duckdb::TupleDataLayout,_true> local_78;
  TupleDataLayout *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_> local_40;
  
  this->grouping_set = grouping_set_p;
  (this->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->op = op_p;
  this_00 = &this->group_types;
  (this->group_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->group_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->group_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grouping_values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->grouping_values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->grouping_values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->layout_ptr).internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->layout_ptr).internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar4 = (undefined1 *)GroupedAggregateData::GroupCount(op_p);
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (puVar4 != (undefined1 *)0x0) {
    do {
      p_Var6 = &(this->grouping_set->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (this->grouping_set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var6->_M_header;
      for (; p_Var5 != (_Base_ptr)0x0;
          p_Var5 = (&p_Var5->_M_left)
                   [*(pointer *)(p_Var5 + 1) <
                    local_98.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start]) {
        if (*(pointer *)(p_Var5 + 1) >=
            local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          p_Var7 = p_Var5;
        }
      }
      p_Var5 = &p_Var6->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var6) &&
         (p_Var5 = p_Var7,
         local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_start < *(pointer *)(p_Var7 + 1))) {
        p_Var5 = &p_Var6->_M_header;
      }
      if ((_Rb_tree_header *)p_Var5 == p_Var6) {
        __position._M_current =
             (this->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->null_groups,
                     __position,(unsigned_long *)&local_98);
        }
        else {
          *__position._M_current =
               (unsigned_long)
               local_98.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
          (this->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start =
           (pointer)&(local_98.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start)->physical_type_;
    } while (local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             _M_impl.super__Vector_impl_data._M_start < puVar4);
  }
  if ((this->grouping_set->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_00,
               &LogicalType::TINYINT);
  }
  pGVar1 = this->grouping_set;
  for (p_Var5 = (pGVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pGVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
    __x = vector<duckdb::LogicalType,_true>::operator[]
                    (&this->op->group_types,*(size_type *)(p_Var5 + 1));
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x
              );
  }
  SetGroupingValues(this);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_98,
             &this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_98,
             &LogicalType::HASH);
  local_68 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::TupleDataLayout,std::allocator<duckdb::TupleDataLayout>>
            (&local_60,&local_68,(allocator<duckdb::TupleDataLayout> *)&local_99);
  local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_68;
  local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_60._M_pi;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  this_02 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(&local_78);
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AggregateObject::CreateAggregateObjects
            ((vector<duckdb::AggregateObject,_true> *)&local_40,&this->op->bindings);
  TupleDataLayout::Initialize
            (this_02,(vector<duckdb::LogicalType,_true> *)&local_58,(Aggregates *)&local_40,true,
             true);
  ::std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>::~vector
            (&local_40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  _Var3._M_pi = local_78.internal.
                super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar2 = local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (this->layout_ptr).internal.
            super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->layout_ptr).internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->layout_ptr).internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.internal.
               super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  return;
}

Assistant:

RadixPartitionedHashTable::RadixPartitionedHashTable(GroupingSet &grouping_set_p, const GroupedAggregateData &op_p)
    : grouping_set(grouping_set_p), op(op_p) {
	auto groups_count = op.GroupCount();
	for (idx_t i = 0; i < groups_count; i++) {
		if (grouping_set.find(i) == grouping_set.end()) {
			null_groups.push_back(i);
		}
	}
	if (grouping_set.empty()) {
		// Fake a single group with a constant value for aggregation without groups
		group_types.emplace_back(LogicalType::TINYINT);
	}
	for (auto &entry : grouping_set) {
		D_ASSERT(entry < op.group_types.size());
		group_types.push_back(op.group_types[entry]);
	}
	SetGroupingValues();

	auto group_types_copy = group_types;
	group_types_copy.emplace_back(LogicalType::HASH);

	auto layout = make_shared_ptr<TupleDataLayout>();
	layout->Initialize(std::move(group_types_copy), AggregateObject::CreateAggregateObjects(op.bindings));
	layout_ptr = std::move(layout);
}